

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

void cleanup_object(void)

{
  object_kind *poVar1;
  object_kind *kind;
  wchar_t idx;
  
  for (kind._4_4_ = 0; kind._4_4_ < (int)(uint)z_info->k_max; kind._4_4_ = kind._4_4_ + 1) {
    poVar1 = k_info + kind._4_4_;
    string_free(poVar1->name);
    string_free(poVar1->text);
    if (kind._4_4_ < (int)(uint)z_info->ordinary_kind_max) {
      string_free(poVar1->effect_msg);
    }
    string_free(poVar1->vis_msg);
    mem_free(poVar1->brands);
    mem_free(poVar1->slays);
    mem_free(poVar1->curses);
    if (kind._4_4_ < (int)(uint)z_info->ordinary_kind_max) {
      free_effect(poVar1->effect);
    }
  }
  mem_free(k_info);
  return;
}

Assistant:

static void cleanup_object(void)
{
	int idx;
	for (idx = 0; idx < z_info->k_max; idx++) {
		struct object_kind *kind = &k_info[idx];
		string_free(kind->name);
		string_free(kind->text);
		if (idx < z_info->ordinary_kind_max) {
			string_free(kind->effect_msg);
		}
		string_free(kind->vis_msg);
		mem_free(kind->brands);
		mem_free(kind->slays);
		mem_free(kind->curses);
		if (idx < z_info->ordinary_kind_max) {
			free_effect(kind->effect);
		}
	}
	mem_free(k_info);
}